

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ImmediateAssertionStatement::fromSyntax
          (Compilation *compilation,ImmediateAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  AssertionKind AVar2;
  int iVar3;
  SourceLocation args_4;
  undefined4 extraout_var;
  ActionBlockSyntax *pAVar4;
  undefined4 extraout_var_00;
  SyntaxNode *this_00;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_01;
  socklen_t in_ECX;
  ASTContext *in_RDX;
  SyntaxKind *in_RSI;
  undefined1 uVar6;
  SourceRange SVar7;
  ImmediateAssertionStatement *result;
  bool isCover;
  bool isFinal;
  bool isDeferred;
  Statement *ifFalse;
  Statement *ifTrue;
  bool bad;
  Expression *cond;
  AssertionKind assertKind;
  Statement *stmt;
  Expression *in_stack_ffffffffffffff40;
  Compilation *compilation_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar8;
  ASTContext *__addr;
  ASTContext *in_stack_ffffffffffffff88;
  SourceLocation in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 uVar9;
  undefined1 uVar10;
  Statement *this_01;
  Statement *local_50;
  bool local_41;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffc0;
  ImmediateAssertionStatement *local_8;
  ASTContext *this;
  
  AVar2 = SemanticFacts::getAssertKind(*in_RSI);
  not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator->
            ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x9ef93e);
  args_4 = (SourceLocation)
           not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9ef94a);
  __addr = in_RDX;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffc0,None);
  iVar3 = Expression::bind(args_4._0_4_,(sockaddr *)__addr,
                           (socklen_t)in_stack_ffffffffffffffc0.m_bits);
  this = (ASTContext *)CONCAT44(extraout_var,iVar3);
  local_41 = Expression::bad(in_stack_ffffffffffffff40);
  if ((!local_41) &&
     (bVar1 = ASTContext::requireBooleanConvertible
                        (this,(Expression *)in_stack_ffffffffffffffc0.m_bits), !bVar1)) {
    local_41 = true;
  }
  local_50 = (Statement *)0x0;
  this_01 = (Statement *)0x0;
  pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                     ((not_null<slang::syntax::ActionBlockSyntax_*> *)0x9ef9f0);
  if (pAVar4->statement != (StatementSyntax *)0x0) {
    pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                       ((not_null<slang::syntax::ActionBlockSyntax_*> *)0x9efa08);
    iVar3 = Statement::bind((int)pAVar4->statement,(sockaddr *)in_RDX,in_ECX);
    local_50 = (Statement *)CONCAT44(extraout_var_00,iVar3);
  }
  pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                     ((not_null<slang::syntax::ActionBlockSyntax_*> *)0x9efa3d);
  if (pAVar4->elseClause != (ElseClauseSyntax *)0x0) {
    not_null<slang::syntax::ActionBlockSyntax_*>::operator->
              ((not_null<slang::syntax::ActionBlockSyntax_*> *)0x9efa55);
    this_00 = not_null<slang::syntax::SyntaxNode_*>::operator->
                        ((not_null<slang::syntax::SyntaxNode_*> *)0x9efa62);
    pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this_00);
    iVar3 = Statement::bind((int)pSVar5,(sockaddr *)in_RDX,in_ECX);
    this_01 = (Statement *)CONCAT44(extraout_var_01,iVar3);
  }
  uVar6 = *(undefined8 *)(in_RSI + 0x1a) != Unknown;
  uVar10 = false;
  if ((bool)uVar6) {
    uVar10 = parsing::Token::valid
                       ((Token *)(*(undefined8 *)(in_RSI + 0x1a) + BlockingEventTriggerStatement));
  }
  uVar8 = AVar2 == CoverProperty || AVar2 == CoverSequence;
  uVar9 = uVar8;
  if ((AVar2 == CoverProperty || AVar2 == CoverSequence) && (this_01 != (Statement *)0x0)) {
    in_stack_ffffffffffffffa0 = 0x100008;
    not_null<slang::syntax::ActionBlockSyntax_*>::operator->
              ((not_null<slang::syntax::ActionBlockSyntax_*> *)0x9efb2a);
    SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = SVar7.startLoc;
    SVar7.startLoc._7_1_ = uVar8;
    SVar7.startLoc._0_7_ = in_stack_ffffffffffffff60;
    SVar7.endLoc = args_4;
    ASTContext::addDiag(in_RDX,SUB84((ulong)__addr >> 0x20,0),SVar7);
    local_41 = true;
  }
  if ((uVar6 & 1) != Invalid >> 8) {
    if (local_50 != (Statement *)0x0) {
      checkDeferredAssertAction((Statement *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    if (this_01 != (Statement *)0x0) {
      checkDeferredAssertAction((Statement *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff90);
  stmt = (Statement *)&stack0xffffffffffffffa6;
  compilation_00 = (Compilation *)&stack0xffffffffffffff78;
  local_8 = BumpAllocator::
            emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
                      ((BumpAllocator *)in_stack_ffffffffffffff90,
                       (AssertionKind *)in_stack_ffffffffffffff88,(Expression *)SVar7.endLoc,
                       (Statement **)SVar7.startLoc,(Statement **)__addr,(bool *)args_4,
                       (bool *)CONCAT17(uVar6,CONCAT16(uVar10,CONCAT15(uVar9,CONCAT14(
                                                  in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0)))),
                       (SourceRange *)this_01);
  if (((local_41 != false) ||
      ((local_50 != (Statement *)0x0 && (bVar1 = Statement::bad(local_50), bVar1)))) ||
     ((this_01 != (Statement *)0x0 && (bVar1 = Statement::bad(this_01), bVar1)))) {
    local_8 = (ImmediateAssertionStatement *)Statement::badStmt(compilation_00,stmt);
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& ImmediateAssertionStatement::fromSyntax(Compilation& compilation,
                                                   const ImmediateAssertionStatementSyntax& syntax,
                                                   const ASTContext& context,
                                                   StatementContext& stmtCtx) {
    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);
    auto& cond = Expression::bind(*syntax.expr->expression, context);
    bool bad = cond.bad();

    if (!bad && !context.requireBooleanConvertible(cond))
        bad = true;

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    bool isDeferred = syntax.delay != nullptr;
    bool isFinal = false;
    if (isDeferred)
        isFinal = syntax.delay->finalKeyword.valid();

    bool isCover = assertKind == AssertionKind::CoverProperty ||
                   assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        context.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }

    if (isDeferred) {
        if (ifTrue)
            checkDeferredAssertAction(*ifTrue, context);
        if (ifFalse)
            checkDeferredAssertAction(*ifFalse, context);
    }

    auto result = compilation.emplace<ImmediateAssertionStatement>(assertKind, cond, ifTrue,
                                                                   ifFalse, isDeferred, isFinal,
                                                                   syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    return *result;
}